

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::resetTestGroupResult(JUnitTestOutput *this)

{
  void *pvVar1;
  long in_RDI;
  JUnitTestCaseResultNode *tmp;
  JUnitTestCaseResultNode *cur;
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  
  **(undefined4 **)(in_RDI + 0x18) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4) = 0;
  SimpleString::SimpleString(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  SimpleString::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)0x20dee1);
  pvVar1 = *(void **)(*(long *)(in_RDI + 0x18) + 0x20);
  while (local_28 = pvVar1, local_28 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_28 + 0x20);
    if (*(long **)((long)local_28 + 0x10) != (long *)0x0) {
      (**(code **)(**(long **)((long)local_28 + 0x10) + 8))();
    }
    if (local_28 != (void *)0x0) {
      JUnitTestCaseResultNode::~JUnitTestCaseResultNode((JUnitTestCaseResultNode *)0x20df42);
      operator_delete(local_28,(size_t)in_stack_ffffffffffffffa8);
    }
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28) = 0;
  return;
}

Assistant:

void JUnitTestOutput::resetTestGroupResult()
{
    impl_->results_.testCount_ = 0;
    impl_->results_.failureCount_ = 0;
    impl_->results_.group_ = "";
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        JUnitTestCaseResultNode* tmp = cur->next_;
        ;
        delete cur->failure_;
        delete cur;
        cur = tmp;
    }
    impl_->results_.head_ = 0;
    impl_->results_.tail_ = 0;
}